

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O2

void cjson_add_object_should_fail_with_null_pointers(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_CreateObject();
  pcVar1 = cJSON_AddObjectToObject((cJSON *)0x0,"object");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x147);
  }
  pcVar1 = cJSON_AddObjectToObject(object,(char *)0x0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x148);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_object_should_fail_with_null_pointers(void)
{
    cJSON *root = cJSON_CreateObject();

    TEST_ASSERT_NULL(cJSON_AddObjectToObject(NULL, "object"));
    TEST_ASSERT_NULL(cJSON_AddObjectToObject(root, NULL));

    cJSON_Delete(root);
}